

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_piz.c
# Opt level: O0

exr_result_t
internal_exr_undo_piz
          (exr_decode_pipeline_t *decode,void *src,uint64_t packsz,void *outptr,uint64_t outsz)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  uint64_t uVar6;
  uint16_t *lut_00;
  size_t sVar7;
  long lVar8;
  void *in_RCX;
  ulong in_RDX;
  exr_decode_pipeline_t *in_RSI;
  long in_RDI;
  ulong in_R8;
  exr_coding_channel_info_t *curc_1;
  int c_1;
  int cury;
  int y;
  int j;
  exr_coding_channel_info_t *curc;
  int c;
  uint64_t bytesToRead;
  uint32_t hufbytes;
  uint16_t *wavbuf;
  uint16_t maxValue;
  uint16_t maxNonZero;
  uint16_t minNonZero;
  size_t hufSpareBytes;
  uint8_t *hufspare;
  uint16_t *lut;
  uint8_t *bitmap;
  exr_result_t rv;
  uint64_t nBytes;
  int wcount;
  int ny;
  int nx;
  uint8_t *packed;
  uint8_t *tmp;
  uint8_t *scratch;
  uint64_t nOut;
  uint8_t *out;
  void *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int iVar9;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar10;
  void **in_stack_ffffffffffffff38;
  exr_transcoding_pipeline_buffer_id_t in_stack_ffffffffffffff44;
  int iVar11;
  exr_decode_pipeline_t *in_stack_ffffffffffffff48;
  uint16_t *bitmap_00;
  undefined4 in_stack_ffffffffffffff88;
  long lVar12;
  undefined4 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffff9e;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint16_t *in_stack_ffffffffffffffb0;
  long local_48;
  ulong sparebytes;
  void *local_38;
  exr_result_t local_4;
  
  sparebytes = 0;
  uVar6 = internal_exr_huf_decompress_spare_bytes();
  local_4 = internal_decode_alloc_buffer
                      (in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38
                       ,(size_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if ((local_4 == 0) &&
     (local_4 = internal_decode_alloc_buffer
                          (in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                           in_stack_ffffffffffffff38,
                           (size_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)),
     local_4 == 0)) {
    lut_00 = (uint16_t *)(*(long *)(in_RDI + 200) + uVar6);
    bitmap_00 = lut_00 + 0x10000;
    memset(bitmap_00,0,0x2000);
    lVar12 = 0;
    if (in_RDX < 4) {
      local_4 = 0x17;
    }
    else {
      uVar1 = unaligned_load16(in_stack_ffffffffffffff20);
      lVar12 = lVar12 + 2;
      uVar2 = unaligned_load16(in_stack_ffffffffffffff20);
      lVar12 = lVar12 + 2;
      if (uVar2 < 0x2000) {
        if (uVar1 <= uVar2) {
          sVar7 = (size_t)(int)(((uint)uVar2 - (uint)uVar1) + 1);
          if (in_RDX < lVar12 + sVar7) {
            return 0x17;
          }
          memcpy((void *)((long)bitmap_00 + (long)(int)(uint)uVar1),
                 (void *)((long)&in_RSI->pipe_size + lVar12),sVar7);
          lVar12 = sVar7 + lVar12;
        }
        reverseLutFromBitmap((uint8_t *)bitmap_00,lut_00);
        if (in_RDX < lVar12 + 4U) {
          local_4 = 0x17;
        }
        else {
          uVar3 = unaligned_load32(in_stack_ffffffffffffff20);
          if (in_RDX < lVar12 + 4 + (ulong)uVar3) {
            local_4 = 0x17;
          }
          else {
            local_4 = internal_huf_decompress
                                (in_RSI,(uint8_t *)
                                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                ),
                                 CONCAT26(in_stack_ffffffffffffff9e,
                                          CONCAT24(in_stack_ffffffffffffff9c,
                                                   in_stack_ffffffffffffff98)),
                                 (uint16_t *)(lVar12 + 4),
                                 CONCAT44(local_4,in_stack_ffffffffffffff88),bitmap_00,sparebytes);
            if (local_4 == 0) {
              for (iVar11 = 0; iVar11 < *(short *)(in_RDI + 0x10); iVar11 = iVar11 + 1) {
                lVar12 = *(long *)(in_RDI + 8) + (long)iVar11 * 0x30;
                iVar5 = *(int *)(lVar12 + 0xc);
                iVar9 = *(int *)(lVar12 + 8);
                iVar4 = (int)*(char *)(lVar12 + 0x19) / 2;
                for (iVar10 = 0; iVar10 < iVar4; iVar10 = iVar10 + 1) {
                  wav_2D_decode(in_stack_ffffffffffffffb0,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                                iVar5,iVar9,(uint16_t)((uint)iVar4 >> 0x10));
                }
              }
              applyLut(lut_00,*(uint16_t **)(in_RDI + 0xb8),in_R8 >> 1);
              local_38 = in_RCX;
              for (iVar11 = 0; iVar11 < *(int *)(in_RDI + 0x2c); iVar11 = iVar11 + 1) {
                iVar5 = iVar11 + *(int *)(in_RDI + 0x28);
                local_48 = *(long *)(in_RDI + 0xb8);
                for (iVar9 = 0; iVar9 < *(short *)(in_RDI + 0x10); iVar9 = iVar9 + 1) {
                  lVar8 = *(long *)(in_RDI + 8) + (long)iVar9 * 0x30;
                  iVar4 = *(int *)(lVar8 + 0xc);
                  sVar7 = (long)*(int *)(lVar8 + 0xc) * (long)*(char *)(lVar8 + 0x19);
                  lVar12 = local_48;
                  if (sVar7 != 0) {
                    lVar12 = (long)*(int *)(lVar8 + 8) * sVar7 + local_48;
                    iVar10 = iVar11;
                    if (1 < *(int *)(lVar8 + 0x14)) {
                      if (iVar5 % *(int *)(lVar8 + 0x14) != 0) goto LAB_00126a6c;
                      iVar10 = iVar11 / *(int *)(lVar8 + 0x14);
                    }
                    memcpy(local_38,(void *)((long)iVar10 * sVar7 + local_48),sVar7);
                    priv_from_native16(local_38,iVar4 * ((int)*(char *)(lVar8 + 0x19) / 2));
                    local_38 = (void *)(sVar7 + (long)local_38);
                    sparebytes = sVar7 + sparebytes;
                  }
LAB_00126a6c:
                  local_48 = lVar12;
                }
              }
              *(ulong *)(in_RDI + 0x68) = sparebytes;
              local_4 = 0x17;
              if (sparebytes == in_R8) {
                local_4 = 0;
              }
            }
          }
        }
      }
      else {
        local_4 = 0x17;
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
internal_exr_undo_piz (
    exr_decode_pipeline_t* decode,
    const void*            src,
    uint64_t               packsz,
    void*                  outptr,
    uint64_t               outsz)
{
    uint8_t*       out  = outptr;
    uint64_t       nOut = 0;
    uint8_t *      scratch, *tmp;
    const uint8_t* packed;
    int            nx, ny, wcount;
    uint64_t       nBytes;
    exr_result_t   rv;
    uint8_t*       bitmap;
    uint16_t*      lut;
    uint8_t*       hufspare;
    size_t         hufSpareBytes = internal_exr_huf_decompress_spare_bytes ();
    uint16_t       minNonZero, maxNonZero, maxValue;
    uint16_t*      wavbuf;
    uint32_t       hufbytes;

    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        outsz + hufSpareBytes);
    if (rv != EXR_ERR_SUCCESS) return rv;

    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH2,
        &(decode->scratch_buffer_2),
        &(decode->scratch_alloc_size_2),
        BITMAP_SIZE * sizeof (uint8_t) + USHORT_RANGE * sizeof (uint16_t) +
            hufSpareBytes);
    if (rv != EXR_ERR_SUCCESS) return rv;

    hufspare = decode->scratch_buffer_2;
    lut      = (uint16_t*) (hufspare + hufSpareBytes);
    bitmap   = (uint8_t*) (lut + USHORT_RANGE);

    //
    // Read range compression data
    //

    memset (bitmap, 0, sizeof (uint8_t) * BITMAP_SIZE);

    nBytes = 0;
    if (sizeof (uint16_t) * 2 > packsz) return EXR_ERR_CORRUPT_CHUNK;

    packed     = src;
    minNonZero = unaligned_load16 (packed + nBytes);
    nBytes += sizeof (uint16_t);
    maxNonZero = unaligned_load16 (packed + nBytes);
    nBytes += sizeof (uint16_t);

    if (maxNonZero >= BITMAP_SIZE) return EXR_ERR_CORRUPT_CHUNK;

    if (minNonZero <= maxNonZero)
    {
        uint64_t bytesToRead = maxNonZero - minNonZero + 1;
        if (nBytes + bytesToRead > packsz) return EXR_ERR_CORRUPT_CHUNK;

        memcpy (bitmap + minNonZero, packed + nBytes, bytesToRead);
        nBytes += bytesToRead;
    }

    maxValue = reverseLutFromBitmap (bitmap, lut);

    //
    // Huffman decoding
    //
    if (nBytes + sizeof (uint32_t) > packsz) return EXR_ERR_CORRUPT_CHUNK;

    hufbytes = unaligned_load32 (packed + nBytes);
    nBytes += sizeof (uint32_t);

    if (nBytes + hufbytes > packsz) return EXR_ERR_CORRUPT_CHUNK;

    wavbuf = decode->scratch_buffer_1;
    rv     = internal_huf_decompress (
        decode,
        packed + nBytes,
        hufbytes,
        wavbuf,
        outsz / 2,
        hufspare,
        hufSpareBytes);
    if (rv != EXR_ERR_SUCCESS) return rv;

    //
    // Wavelet decoding
    //

    wavbuf = decode->scratch_buffer_1;
    for (int c = 0; c < decode->channel_count; ++c)
    {
        const exr_coding_channel_info_t* curc = decode->channels + c;

        nx     = curc->width;
        ny     = curc->height;
        wcount = (int) (curc->bytes_per_element / 2);
        for (int j = 0; j < wcount; ++j)
        {
            wav_2D_decode (wavbuf + j, nx, wcount, ny, wcount * nx, maxValue);
        }
        wavbuf += nx * ny * wcount;
    }

    //
    // Expand the pixel data to their original range
    //

    wavbuf = decode->scratch_buffer_1;
    applyLut (lut, wavbuf, outsz / 2);

    //
    // Rearrange the pixel data into the format expected by the caller.
    //

    for (int y = 0; y < decode->chunk.height; ++y)
    {
        int cury = y + decode->chunk.start_y;

        scratch = decode->scratch_buffer_1;
        for (int c = 0; c < decode->channel_count; ++c)
        {
            const exr_coding_channel_info_t* curc = decode->channels + c;

            nx = curc->width;
            ny = curc->height;
            nBytes =
                ((uint64_t) curc->width) * ((uint64_t) curc->bytes_per_element);

            if (nBytes == 0) continue;

            tmp = scratch;
            scratch += ((uint64_t) ny) * nBytes;

            if (curc->y_samples > 1)
            {
                if ((cury % curc->y_samples) != 0) continue;
                tmp += ((uint64_t) (y / curc->y_samples)) * nBytes;
            }
            else
                tmp += ((uint64_t) y) * nBytes;

            memcpy (out, tmp, nBytes);
            priv_from_native16 (out, nx * (curc->bytes_per_element / 2));
            out += nBytes;
            nOut += nBytes;
        }
    }

    decode->bytes_decompressed = nOut;
    return (nOut == outsz) ? EXR_ERR_SUCCESS : EXR_ERR_CORRUPT_CHUNK;
}